

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void readPic<PicHeaderPS3>(istream *stream,PicHeader *header)

{
  bool bVar1;
  value_type_conflict4 vVar2;
  value_type_conflict3 vVar3;
  int iVar4;
  uint32_t uVar5;
  __normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_> *__lhs;
  reference pPVar6;
  undefined1 *in_RSI;
  long in_RDI;
  PicChunkPS3 c;
  PicChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<PicChunk,_std::allocator<PicChunk>_> *__range1;
  PicHeaderPS3 h;
  istream *in_stack_ffffffffffffff98;
  istream *in_stack_ffffffffffffffa0;
  PicChunkPS3 local_50;
  size_type in_stack_ffffffffffffffb8;
  vector<PicChunk,_std::allocator<PicChunk>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_> local_38;
  undefined1 *local_30;
  PicHeaderPS3 local_28;
  undefined1 *local_10;
  long local_8;
  
  *in_RSI = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  readRaw<PicHeaderPS3>(in_stack_ffffffffffffffa0);
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x117893);
  *(value_type_conflict3 *)(local_10 + 4) = vVar3;
  iVar4 = PicHeaderPS3::getVersion(&local_28);
  *(int *)(local_10 + 8) = iVar4;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x1178bf);
  *(value_type_conflict4 *)(local_10 + 0xe) = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x1178d9);
  *(value_type_conflict4 *)(local_10 + 0xc) = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x1178f3);
  *(value_type_conflict4 *)(local_10 + 0x10) = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x11790d);
  *(value_type_conflict4 *)(local_10 + 0x12) = vVar2;
  __lhs = (__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_> *)
          (local_10 + 0x18);
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x117935);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  PicHeaderPS3::bytesToSkip(&local_28);
  std::istream::ignore(local_8);
  local_30 = local_10 + 0x18;
  local_38._M_current =
       (PicChunk *)
       std::vector<PicChunk,_std::allocator<PicChunk>_>::begin
                 ((vector<PicChunk,_std::allocator<PicChunk>_> *)in_stack_ffffffffffffff98);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::end
            ((vector<PicChunk,_std::allocator<PicChunk>_> *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>
                              *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    pPVar6 = __gnu_cxx::
             __normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
             operator*(&local_38);
    local_50 = readRaw<PicChunkPS3>(in_stack_ffffffffffffff98);
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x1179d0);
    pPVar6->x = vVar2;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x1179e9);
    pPVar6->y = vVar2;
    vVar3 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                   *)0x117a03);
    pPVar6->offset = vVar3;
    uVar5 = PicChunkPS3::getSize(&local_50);
    pPVar6->size = uVar5;
    __gnu_cxx::__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
    operator++(&local_38);
  }
  return;
}

Assistant:

void readPic(std::istream& stream, PicHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.filesize = h.filesize.value();
	header.version = h.getVersion();
	header.eh = h.eh.value();
	header.ew = h.ew.value();
	header.width = h.width.value();
	header.height = h.height.value();
	header.chunks.resize(h.chunks.value());

	stream.ignore(h.bytesToSkip());

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.x = c.x.value();
		chunk.y = c.y.value();
		chunk.offset = c.offset.value();
		chunk.size = c.getSize();
	}
}